

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::FFlux
          (MLEBABecLap *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location flux_loc,int face_only)

{
  Box *pBVar1;
  size_t __n;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Location LVar16;
  Location LVar17;
  Vector<int,_std::allocator<int>_> *pVVar18;
  FArrayBox *pFVar19;
  FArrayBox *pFVar20;
  FArrayBox *pFVar21;
  FArrayBox *pFVar22;
  FArrayBox *pFVar23;
  FArrayBox *pFVar24;
  FabArray<amrex::IArrayBox> *this_00;
  double *pdVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  uint ncomp;
  FabType FVar33;
  int iVar34;
  EBFArrayBoxFactory *this_01;
  FabArray<amrex::EBCellFlagFab> *pFVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  int *piVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  int *piVar60;
  long lVar61;
  ulong uVar62;
  int iVar63;
  undefined8 uVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  int j;
  int iVar71;
  undefined8 uVar72;
  long lVar73;
  int lof;
  int iVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  int iVar79;
  EBFArrayBoxFactory *this_02;
  double *pdVar80;
  double *pdVar81;
  double *pdVar82;
  double *pdVar83;
  double *pdVar84;
  uint local_4e8;
  Box local_3fc;
  Array4<const_int> local_3e0;
  undefined1 local_3a0 [32];
  Dim3 local_380 [2];
  int iStack_368;
  Array4<const_double> local_360;
  Array4<const_double> local_320;
  Array4<const_double> local_2e0;
  Box local_29c;
  Array4<const_double> local_280;
  Array4<const_double> local_240;
  Array<const_MultiCutFab_*,_3> local_200;
  Array<const_MultiCutFab_*,_3> local_1e8;
  undefined1 local_1d0 [16];
  FArrayBox *local_1c0;
  Long LStack_1b8;
  Long local_1b0;
  Long LStack_1a8;
  Dim3 local_1a0 [2];
  int iStack_188;
  double *local_180;
  long local_178;
  long local_170;
  long local_168;
  int local_160;
  int local_15c;
  int local_158;
  Dim3 local_154;
  int local_148;
  double local_140;
  double *local_138;
  long local_130;
  long local_128;
  long local_120;
  Dim3 local_118;
  ulong local_10c;
  int local_104;
  int local_100;
  double *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Dim3 local_d8;
  ulong local_cc;
  int local_c4;
  int local_c0;
  MultiCutFab *local_b8;
  MultiCutFab *pMStack_b0;
  MultiCutFab *local_a8;
  Long LStack_a0;
  Dim3 aDStack_98 [2];
  int iStack_80;
  int *local_78;
  Long LStack_70;
  Long local_68;
  Long LStack_60;
  Dim3 local_58 [2];
  int iStack_40;
  bool local_38;
  bool local_37;
  
  MFIter::tilebox(&local_3fc,mfi);
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  lVar40 = **(long **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar40 == 0) {
    this_02 = (EBFArrayBoxFactory *)0x0;
    pFVar35 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar40,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    pFVar35 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_02 = (EBFArrayBoxFactory *)0x0;
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      pFVar35 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
      this_02 = this_01;
    }
  }
  lVar40 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  pVVar18 = mfi->local_index_map;
  piVar39 = &mfi->currentIndex;
  piVar60 = piVar39;
  if (pVVar18 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar60 = (pVVar18->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar39;
  }
  lVar36 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar53 = (long)*piVar60;
  pFVar19 = *(FArrayBox **)(*(long *)(lVar40 + 0x108) + lVar53 * 8);
  pFVar20 = *(FArrayBox **)(*(long *)(lVar40 + 0x288) + lVar53 * 8);
  pFVar21 = *(FArrayBox **)(*(long *)(lVar40 + 0x408) + lVar53 * 8);
  iVar51 = local_3fc.bigend.vect[1] + (uint)((local_3fc.btype.itype & 2) == 0);
  iVar41 = local_3fc.bigend.vect[2] + (uint)((local_3fc.btype.itype & 4) == 0);
  if (pFVar35 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
    pFVar22 = flux->_M_elems[0];
    pFVar23 = flux->_M_elems[1];
    pFVar24 = flux->_M_elems[2];
    if (pVVar18 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar39 = (pVVar18->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + *piVar39;
    }
    iVar38 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[0];
    iVar42 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[1];
    iVar52 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[0];
    iVar56 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[1];
    iVar5 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[0];
    iVar6 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[1];
    iVar74 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[2];
    iVar7 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[0];
    this_00 = *(FabArray<amrex::IArrayBox> **)
               &(this->m_cc_mask).
                super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>;
    iVar8 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[2];
    pdVar83 = (pFVar22->super_BaseFab<double>).dptr;
    iVar34 = (pFVar22->super_BaseFab<double>).nvar;
    iVar9 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[1];
    iVar47 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[2];
    iVar10 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[2];
    pdVar84 = (pFVar23->super_BaseFab<double>).dptr;
    iVar11 = (pFVar23->super_BaseFab<double>).nvar;
    iVar71 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[0];
    iVar63 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[1];
    iVar12 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[0];
    iVar13 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[1];
    iVar79 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[2];
    iVar14 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[2];
    pdVar82 = (pFVar24->super_BaseFab<double>).dptr;
    iVar15 = (pFVar24->super_BaseFab<double>).nvar;
    FVar33 = EBCellFlagFab::getType
                       ((pFVar35->m_fabs_v).
                        super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar39],&local_3fc);
    if (FVar33 != regular) {
      iVar38 = iVar38 + 1;
      iVar42 = iVar42 + 1;
      iVar52 = iVar52 + 1;
      iVar56 = iVar56 + 1;
      iVar71 = iVar71 + 1;
      iVar63 = iVar63 + 1;
      iVar74 = iVar74 + 1;
      iVar47 = iVar47 + 1;
      iVar79 = iVar79 + 1;
      local_178 = (long)(iVar38 - iVar5);
      lVar75 = (long)(iVar42 - iVar6);
      lVar67 = (long)(iVar52 - iVar7);
      lVar40 = (long)(iVar56 - iVar9);
      lVar46 = (long)(iVar71 - iVar12);
      lVar48 = (long)(iVar63 - iVar13);
      lVar76 = lVar75 * local_178;
      lVar53 = lVar40 * lVar67;
      lVar43 = lVar48 * lVar46;
      iVar65 = (~local_3fc.btype.itype & 1) + local_3fc.bigend.vect[0];
      lVar57 = (iVar74 - iVar8) * lVar76;
      lVar68 = (iVar47 - iVar10) * lVar53;
      lVar54 = (iVar79 - iVar14) * lVar43;
      if (FVar33 == covered) {
        lVar36 = (long)local_3fc.smallend.vect[0];
        lVar49 = (long)local_3fc.smallend.vect[2];
        uVar37 = (ulong)ncomp;
        if ((int)ncomp < 1) {
          uVar37 = 0;
        }
        lVar61 = (long)local_3fc.smallend.vect[1];
        pdVar83 = pdVar83 + (((((lVar49 - iVar8) * lVar75 + lVar61) - (long)iVar6) * local_178 +
                             lVar36) - (long)iVar5);
        for (uVar62 = 0; pdVar81 = pdVar83, iVar42 = local_3fc.smallend.vect[2], uVar62 != uVar37;
            uVar62 = uVar62 + 1) {
          for (; pdVar80 = pdVar81, iVar56 = local_3fc.smallend.vect[1],
              iVar42 <= local_3fc.bigend.vect[2]; iVar42 = iVar42 + 1) {
            for (; iVar56 <= local_3fc.bigend.vect[1]; iVar56 = iVar56 + 1) {
              if (local_3fc.smallend.vect[0] <= iVar65) {
                memset(pdVar80,0,(ulong)(uint)(iVar65 - local_3fc.smallend.vect[0]) * 8 + 8);
              }
              pdVar80 = pdVar80 + ((long)iVar38 - (long)iVar5);
            }
            pdVar81 = pdVar81 + lVar76;
          }
          pdVar83 = pdVar83 + lVar57;
        }
        __n = (ulong)(uint)(local_3fc.bigend.vect[0] - local_3fc.smallend.vect[0]) * 8 + 8;
        pdVar84 = pdVar84 + (((((lVar49 - iVar10) * lVar40 + lVar61) - (long)iVar9) * lVar67 +
                             lVar36) - (long)iVar7);
        for (uVar62 = 0; pdVar83 = pdVar84, iVar38 = local_3fc.smallend.vect[2], uVar62 != uVar37;
            uVar62 = uVar62 + 1) {
          for (; pdVar81 = pdVar83, iVar42 = local_3fc.smallend.vect[1],
              iVar38 <= local_3fc.bigend.vect[2]; iVar38 = iVar38 + 1) {
            for (; iVar42 <= iVar51; iVar42 = iVar42 + 1) {
              if (local_3fc.smallend.vect[0] <= local_3fc.bigend.vect[0]) {
                memset(pdVar81,0,__n);
              }
              pdVar81 = pdVar81 + ((long)iVar52 - (long)iVar7);
            }
            pdVar83 = pdVar83 + lVar53;
          }
          pdVar84 = pdVar84 + lVar68;
        }
        pdVar82 = pdVar82 + (((((lVar49 - iVar14) * lVar48 + lVar61) - (long)iVar13) * lVar46 +
                             lVar36) - (long)iVar12);
        for (uVar62 = 0; pdVar83 = pdVar82, iVar51 = local_3fc.smallend.vect[2], uVar62 != uVar37;
            uVar62 = uVar62 + 1) {
          for (; pdVar84 = pdVar83, iVar38 = local_3fc.smallend.vect[1], iVar51 <= iVar41;
              iVar51 = iVar51 + 1) {
            for (; iVar38 <= local_3fc.bigend.vect[1]; iVar38 = iVar38 + 1) {
              if (local_3fc.smallend.vect[0] <= local_3fc.bigend.vect[0]) {
                memset(pdVar84,0,__n);
              }
              pdVar84 = pdVar84 + ((long)iVar71 - (long)iVar12);
            }
            pdVar83 = pdVar83 + lVar43;
          }
          pdVar82 = pdVar82 + lVar54;
        }
        return;
      }
      local_154.y = iVar42;
      local_154.x = iVar38;
      uVar72._4_4_ = iVar56;
      uVar72._0_4_ = iVar52;
      uVar64._4_4_ = iVar63;
      uVar64._0_4_ = iVar71;
      local_4e8 = local_3fc.btype.itype | 1;
      local_180 = pdVar83;
      local_170 = lVar76;
      local_168 = lVar57;
      local_160 = iVar5;
      local_15c = iVar6;
      local_158 = iVar8;
      local_154.z = iVar74;
      local_148 = iVar34;
      local_1d0._8_4_ = iVar65;
      if (flux_loc == FaceCentroid) {
        EBFArrayBoxFactory::getAreaFrac(&local_1e8,this_02);
        EBFArrayBoxFactory::getFaceCent(&local_200,this_02);
        MultiCutFab::const_array(&local_2e0,local_1e8._M_elems[0],mfi);
        MultiCutFab::const_array(&local_320,local_1e8._M_elems[1],mfi);
        MultiCutFab::const_array(&local_360,local_1e8._M_elems[2],mfi);
        MultiCutFab::const_array((Array4<const_double> *)local_3a0,local_200._M_elems[0],mfi);
        MultiCutFab::const_array(&local_280,local_200._M_elems[1],mfi);
        MultiCutFab::const_array(&local_240,local_200._M_elems[2],mfi);
        pBVar1 = &(sol->super_BaseFab<double>).domain;
        uVar26._0_4_ = (pBVar1->smallend).vect[0];
        uVar26._4_4_ = (pBVar1->smallend).vect[1];
        lVar48 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        lVar40 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
        lVar55 = (lVar40 - (pBVar1->smallend).vect[0]) + 1;
        uVar37 = lVar40 + 1U & 0xffffffff | lVar48 << 0x20;
        pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
        uVar27._0_4_ = (pBVar1->smallend).vect[0];
        uVar27._4_4_ = (pBVar1->smallend).vect[1];
        lVar58 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        lVar61 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
        lVar50 = (lVar61 - (pBVar1->smallend).vect[0]) + 1;
        lVar69 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar20->super_BaseFab<double>).domain;
        uVar28._0_4_ = (pBVar1->smallend).vect[0];
        uVar28._4_4_ = (pBVar1->smallend).vect[1];
        lVar44 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
        lVar75 = (lVar44 - (pBVar1->smallend).vect[0]) + 1;
        lVar77 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar21->super_BaseFab<double>).domain;
        uVar29._0_4_ = (pBVar1->smallend).vect[0];
        uVar29._4_4_ = (pBVar1->smallend).vect[1];
        lVar45 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[0];
        lVar73 = (lVar45 - (pBVar1->smallend).vect[0]) + 1;
        pdVar83 = (sol->super_BaseFab<double>).dptr;
        iVar38 = (sol->super_BaseFab<double>).nvar;
        iVar42 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
        lVar40 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar66 = (lVar48 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar55;
        lVar48 = (lVar40 - iVar42) * lVar66;
        pdVar81 = (pFVar19->super_BaseFab<double>).dptr;
        iVar52 = (pFVar19->super_BaseFab<double>).nvar;
        iVar56 = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
        lVar57 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar59 = (lVar58 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * lVar50;
        pdVar80 = (pFVar20->super_BaseFab<double>).dptr;
        iVar5 = (pFVar20->super_BaseFab<double>).nvar;
        iVar6 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
        lVar76 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar70 = (lVar69 - (pFVar20->super_BaseFab<double>).domain.smallend.vect[1]) * lVar75;
        pdVar25 = (pFVar21->super_BaseFab<double>).dptr;
        iVar74 = (pFVar21->super_BaseFab<double>).nvar;
        iVar8 = (pFVar21->super_BaseFab<double>).domain.smallend.vect[2];
        lVar49 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar78 = (lVar77 - (pFVar21->super_BaseFab<double>).domain.smallend.vect[1]) * lVar73;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3e0,this_00,mfi);
        dVar2 = this->m_b_scalar;
        local_140 = *(double *)(lVar36 + 0x38) * dVar2;
        dVar3 = *(double *)(lVar36 + 0x40);
        dVar4 = *(double *)(lVar36 + 0x48);
        LVar16 = this->m_beta_loc;
        LVar17 = this->m_phi_loc;
        if (LVar17 == CellCentroid) {
          Abort_host("phi_on_centroid is still a WIP");
        }
        local_29c.smallend.vect[0] = local_3fc.smallend.vect[0];
        local_29c.smallend.vect[1] = local_3fc.smallend.vect[1];
        local_29c.smallend.vect[2] = local_3fc.smallend.vect[2];
        local_29c.bigend.vect[1] = local_3fc.bigend.vect[1];
        local_29c.bigend.vect[2] = local_3fc.bigend.vect[2];
        local_29c.btype.itype = local_4e8;
        local_1d0._4_4_ = local_3fc.smallend.vect[0];
        local_1d0._0_4_ = face_only;
        local_1c0 = (FArrayBox *)local_2e0.p;
        LStack_1b8 = local_2e0.jstride;
        local_1b0 = local_2e0.kstride;
        LStack_1a8 = local_2e0.nstride;
        local_1a0[0].x = local_2e0.begin.x;
        local_1a0[0].y = local_2e0.begin.y;
        local_1a0[1].z = local_2e0.end.z;
        iStack_188 = local_2e0.ncomp;
        local_104 = (int)lVar57;
        local_38 = LVar16 == FaceCentroid;
        iVar34 = (int)lVar40;
        local_37 = LVar17 == CellCentroid;
        aDStack_98[1].z = local_380[1].z;
        iStack_80 = iStack_368;
        aDStack_98[0].x = local_380[0].x;
        aDStack_98[0].y = local_380[0].y;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_29c.bigend.vect[0] = iVar65;
        local_138 = pdVar81;
        local_130 = lVar50;
        local_128 = lVar59;
        local_120 = (lVar57 - iVar56) * lVar59;
        local_118._0_8_ = uVar27;
        local_118.z = iVar56;
        local_10c = lVar61 + 1U & 0xffffffff | lVar58 << 0x20;
        local_100 = iVar52;
        local_f8 = pdVar83;
        local_f0 = lVar55;
        local_e8 = lVar66;
        local_e0 = lVar48;
        local_d8._0_8_ = uVar26;
        local_d8.z = iVar42;
        local_cc = uVar37;
        local_c4 = iVar34;
        local_c0 = iVar38;
        LoopConcurrent<amrex::mlebabeclap_flux_x(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_29c,ncomp,(anon_class_416_12_0bbc6dcc *)local_1d0);
        local_29c.smallend.vect[0] = local_3fc.smallend.vect[0];
        local_29c.smallend.vect[1] = local_3fc.smallend.vect[1];
        local_29c.smallend.vect[2] = local_3fc.smallend.vect[2];
        local_29c.bigend.vect[0] = local_3fc.bigend.vect[0];
        local_29c.bigend.vect[2] = local_3fc.bigend.vect[2];
        local_1d0._4_4_ = local_3fc.smallend.vect[1];
        local_1c0 = (FArrayBox *)local_320.p;
        LStack_1b8 = local_320.jstride;
        local_1b0 = local_320.kstride;
        LStack_1a8 = local_320.nstride;
        local_1a0[0].x = local_320.begin.x;
        local_1a0[0].y = local_320.begin.y;
        local_1a0[1].z = local_320.end.z;
        iStack_188 = local_320.ncomp;
        local_104 = (int)lVar76;
        local_38 = LVar16 == FaceCentroid;
        local_37 = LVar17 == CellCentroid;
        aDStack_98[1].z = local_280.end.z;
        iStack_80 = local_280.ncomp;
        aDStack_98[0].x = local_280.begin.x;
        aDStack_98[0].y = local_280.begin.y;
        local_a8 = (MultiCutFab *)local_280.kstride;
        LStack_a0 = local_280.nstride;
        local_b8 = (MultiCutFab *)local_280.p;
        pMStack_b0 = (MultiCutFab *)local_280.jstride;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_29c.bigend.vect[1] = iVar51;
        local_29c.btype.itype = local_3fc.btype.itype | 2;
        local_180 = pdVar84;
        local_178 = lVar67;
        local_170 = lVar53;
        local_168 = lVar68;
        local_160 = iVar7;
        local_15c = iVar9;
        local_158 = iVar10;
        local_154._0_8_ = uVar72;
        local_154.z = iVar47;
        local_148 = iVar11;
        local_140 = dVar3 * dVar2;
        local_138 = pdVar80;
        local_130 = lVar75;
        local_128 = lVar70;
        local_120 = (lVar76 - iVar6) * lVar70;
        local_118._0_8_ = uVar28;
        local_118.z = iVar6;
        local_10c = lVar44 + 1U & 0xffffffff | lVar69 << 0x20;
        local_100 = iVar5;
        local_f8 = pdVar83;
        local_f0 = lVar55;
        local_e8 = lVar66;
        local_e0 = lVar48;
        local_d8._0_8_ = uVar26;
        local_d8.z = iVar42;
        local_cc = uVar37;
        local_c4 = iVar34;
        local_c0 = iVar38;
        local_1d0._8_4_ = iVar51;
        LoopConcurrent<amrex::mlebabeclap_flux_y(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_29c,ncomp,(anon_class_416_12_3e7d91eb *)local_1d0);
        local_29c.smallend.vect[0] = local_3fc.smallend.vect[0];
        local_29c.smallend.vect[1] = local_3fc.smallend.vect[1];
        local_29c.smallend.vect[2] = local_3fc.smallend.vect[2];
        local_29c.bigend.vect[0] = local_3fc.bigend.vect[0];
        local_29c.bigend.vect[1] = local_3fc.bigend.vect[1];
        local_38 = LVar16 == FaceCentroid;
        local_1d0._4_4_ = local_3fc.smallend.vect[2];
        local_1d0._8_4_ = iVar41;
        local_1c0 = (FArrayBox *)local_360.p;
        LStack_1b8 = local_360.jstride;
        local_1b0 = local_360.kstride;
        LStack_1a8 = local_360.nstride;
        local_1a0[0].x = local_360.begin.x;
        local_1a0[0].y = local_360.begin.y;
        local_1a0[1].z = local_360.end.z;
        iStack_188 = local_360.ncomp;
        local_104 = (int)lVar49;
        local_37 = LVar17 == CellCentroid;
        aDStack_98[1].z = local_240.end.z;
        iStack_80 = local_240.ncomp;
        aDStack_98[0].x = local_240.begin.x;
        aDStack_98[0].y = local_240.begin.y;
        local_a8 = (MultiCutFab *)local_240.kstride;
        LStack_a0 = local_240.nstride;
        local_b8 = (MultiCutFab *)local_240.p;
        pMStack_b0 = (MultiCutFab *)local_240.jstride;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_29c.bigend.vect[2] = iVar41;
        local_29c.btype.itype = local_3fc.btype.itype | 4;
        local_180 = pdVar82;
        local_178 = lVar46;
        local_170 = lVar43;
        local_168 = lVar54;
        local_160 = iVar12;
        local_15c = iVar13;
        local_158 = iVar14;
        local_154._0_8_ = uVar64;
        local_154.z = iVar79;
        local_148 = iVar15;
        local_140 = dVar2 * dVar4;
        local_138 = pdVar25;
        local_130 = lVar73;
        local_128 = lVar78;
        local_120 = (lVar49 - iVar8) * lVar78;
        local_118._0_8_ = uVar29;
        local_118.z = iVar8;
        local_10c = lVar45 + 1U & 0xffffffff | lVar77 << 0x20;
        local_100 = iVar74;
        local_f8 = pdVar83;
        local_f0 = lVar55;
        local_e8 = lVar66;
        local_e0 = lVar48;
        local_d8._0_8_ = uVar26;
        local_d8.z = iVar42;
        local_cc = uVar37;
        local_c4 = iVar34;
        local_c0 = iVar38;
        LoopConcurrent<amrex::mlebabeclap_flux_z(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_29c,ncomp,(anon_class_416_12_713eb60a *)local_1d0);
        return;
      }
      EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&local_280,this_02);
      MultiCutFab::const_array(&local_2e0,(MultiCutFab *)local_280.p,mfi);
      MultiCutFab::const_array(&local_320,(MultiCutFab *)local_280.jstride,mfi);
      MultiCutFab::const_array(&local_360,(MultiCutFab *)local_280.kstride,mfi);
      lVar76 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      pBVar1 = &(sol->super_BaseFab<double>).domain;
      uVar32._0_4_ = (pBVar1->smallend).vect[0];
      uVar32._4_4_ = (pBVar1->smallend).vect[1];
      lVar40 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
      lVar48 = (lVar40 - (pBVar1->smallend).vect[0]) + 1;
      uVar37 = lVar40 + 1U & 0xffffffff | lVar76 << 0x20;
      lVar40 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
      local_118.x = (pBVar1->smallend).vect[0];
      local_118.y = (pBVar1->smallend).vect[1];
      lVar57 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
      local_130 = (lVar57 - (pBVar1->smallend).vect[0]) + 1;
      local_10c = lVar57 + 1U & 0xffffffff | lVar40 << 0x20;
      lVar49 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      pBVar1 = &(pFVar20->super_BaseFab<double>).domain;
      uVar30._0_4_ = (pBVar1->smallend).vect[0];
      uVar30._4_4_ = (pBVar1->smallend).vect[1];
      lVar55 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
      lVar57 = (lVar55 - (pBVar1->smallend).vect[0]) + 1;
      lVar75 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      pBVar1 = &(pFVar21->super_BaseFab<double>).domain;
      uVar31._0_4_ = (pBVar1->smallend).vect[0];
      uVar31._4_4_ = (pBVar1->smallend).vect[1];
      lVar58 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[0];
      lVar50 = (lVar58 - (pBVar1->smallend).vect[0]) + 1;
      dVar2 = this->m_b_scalar;
      local_140 = *(double *)(lVar36 + 0x38) * dVar2;
      dVar3 = *(double *)(lVar36 + 0x40);
      dVar4 = *(double *)(lVar36 + 0x48);
      pdVar83 = (sol->super_BaseFab<double>).dptr;
      iVar38 = (sol->super_BaseFab<double>).nvar;
      iVar42 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
      local_138 = (pFVar19->super_BaseFab<double>).dptr;
      local_100 = (pFVar19->super_BaseFab<double>).nvar;
      local_118.z = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
      pdVar81 = (pFVar20->super_BaseFab<double>).dptr;
      iVar52 = (pFVar20->super_BaseFab<double>).nvar;
      iVar56 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
      pdVar80 = (pFVar21->super_BaseFab<double>).dptr;
      iVar5 = (pFVar21->super_BaseFab<double>).nvar;
      iVar6 = (pFVar21->super_BaseFab<double>).domain.smallend.vect[2];
      local_3a0._0_4_ = local_3fc.smallend.vect[0];
      local_3a0._4_4_ = local_3fc.smallend.vect[1];
      local_3a0._8_4_ = local_3fc.smallend.vect[2];
      local_3a0._16_4_ = local_3fc.bigend.vect[1];
      local_3a0._20_4_ = local_3fc.bigend.vect[2];
      local_3a0._24_4_ = local_4e8;
      local_1d0._4_4_ = local_3fc.smallend.vect[0];
      local_1d0._0_4_ = face_only;
      local_1c0 = (FArrayBox *)local_2e0.p;
      LStack_1b8 = local_2e0.jstride;
      local_1b0 = local_2e0.kstride;
      LStack_1a8 = local_2e0.nstride;
      local_1a0[0].x = local_2e0.begin.x;
      local_1a0[0].y = local_2e0.begin.y;
      local_1a0[1].z = local_2e0.end.z;
      iStack_188 = local_2e0.ncomp;
      local_128 = (lVar40 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * local_130;
      lVar40 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_120 = (lVar40 - local_118.z) * local_128;
      local_104 = (int)lVar40;
      lVar44 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      lVar76 = (lVar76 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar48;
      lVar59 = (lVar44 - iVar42) * lVar76;
      lVar61 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      lVar36 = (lVar49 - (pFVar20->super_BaseFab<double>).domain.smallend.vect[1]) * lVar57;
      lVar45 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      lVar40 = (lVar75 - (pFVar21->super_BaseFab<double>).domain.smallend.vect[1]) * lVar50;
      iVar74 = (int)lVar44;
      local_3a0._12_4_ = iVar65;
      local_f8 = pdVar83;
      local_f0 = lVar48;
      local_e8 = lVar76;
      local_e0 = lVar59;
      local_d8._0_8_ = uVar32;
      local_d8.z = iVar42;
      local_cc = uVar37;
      local_c4 = iVar74;
      local_c0 = iVar38;
      LoopConcurrent<amrex::mlebabeclap_flux_x_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)local_3a0,ncomp,(anon_class_280_8_76b9537a *)local_1d0);
      local_3a0._0_4_ = local_3fc.smallend.vect[0];
      local_3a0._4_4_ = local_3fc.smallend.vect[1];
      local_3a0._8_4_ = local_3fc.smallend.vect[2];
      local_3a0._12_4_ = local_3fc.bigend.vect[0];
      local_3a0._20_4_ = local_3fc.bigend.vect[2];
      local_1d0._4_4_ = local_3fc.smallend.vect[1];
      local_1c0 = (FArrayBox *)local_320.p;
      LStack_1b8 = local_320.jstride;
      local_1b0 = local_320.kstride;
      LStack_1a8 = local_320.nstride;
      local_1a0[0].x = local_320.begin.x;
      local_1a0[0].y = local_320.begin.y;
      local_1a0[1].z = local_320.end.z;
      iStack_188 = local_320.ncomp;
      local_104 = (int)lVar61;
      local_3a0._16_4_ = iVar51;
      local_3a0._24_4_ = local_3fc.btype.itype | 2;
      local_180 = pdVar84;
      local_178 = lVar67;
      local_170 = lVar53;
      local_168 = lVar68;
      local_160 = iVar7;
      local_15c = iVar9;
      local_158 = iVar10;
      local_154._0_8_ = uVar72;
      local_154.z = iVar47;
      local_148 = iVar11;
      local_140 = dVar3 * dVar2;
      local_138 = pdVar81;
      local_130 = lVar57;
      local_128 = lVar36;
      local_120 = (lVar61 - iVar56) * lVar36;
      local_118._0_8_ = uVar30;
      local_118.z = iVar56;
      local_10c = lVar55 + 1U & 0xffffffff | lVar49 << 0x20;
      local_100 = iVar52;
      local_f8 = pdVar83;
      local_f0 = lVar48;
      local_e8 = lVar76;
      local_e0 = lVar59;
      local_d8._0_8_ = uVar32;
      local_d8.z = iVar42;
      local_cc = uVar37;
      local_c4 = iVar74;
      local_c0 = iVar38;
      local_1d0._8_4_ = iVar51;
      LoopConcurrent<amrex::mlebabeclap_flux_y_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)local_3a0,ncomp,(anon_class_280_8_76c7e33a *)local_1d0);
      local_3a0._0_4_ = local_3fc.smallend.vect[0];
      local_3a0._4_4_ = local_3fc.smallend.vect[1];
      local_3a0._8_4_ = local_3fc.smallend.vect[2];
      local_3a0._12_4_ = local_3fc.bigend.vect[0];
      local_3a0._16_4_ = local_3fc.bigend.vect[1];
      local_1d0._4_4_ = local_3fc.smallend.vect[2];
      local_1d0._8_4_ = iVar41;
      local_1c0 = (FArrayBox *)local_360.p;
      LStack_1b8 = local_360.jstride;
      local_1b0 = local_360.kstride;
      LStack_1a8 = local_360.nstride;
      local_1a0[0].x = local_360.begin.x;
      local_1a0[0].y = local_360.begin.y;
      local_1a0[1].z = local_360.end.z;
      iStack_188 = local_360.ncomp;
      local_104 = (int)lVar45;
      local_3a0._20_4_ = iVar41;
      local_3a0._24_4_ = local_3fc.btype.itype | 4;
      local_180 = pdVar82;
      local_178 = lVar46;
      local_170 = lVar43;
      local_168 = lVar54;
      local_160 = iVar12;
      local_15c = iVar13;
      local_158 = iVar14;
      local_154._0_8_ = uVar64;
      local_154.z = iVar79;
      local_148 = iVar15;
      local_140 = dVar2 * dVar4;
      local_138 = pdVar80;
      local_130 = lVar50;
      local_128 = lVar40;
      local_120 = (lVar45 - iVar6) * lVar40;
      local_118._0_8_ = uVar31;
      local_118.z = iVar6;
      local_10c = lVar58 + 1U & 0xffffffff | lVar75 << 0x20;
      local_100 = iVar5;
      local_f8 = pdVar83;
      local_f0 = lVar48;
      local_e8 = lVar76;
      local_e0 = lVar59;
      local_d8._0_8_ = uVar32;
      local_d8.z = iVar42;
      local_cc = uVar37;
      local_c4 = iVar74;
      local_c0 = iVar38;
      LoopConcurrent<amrex::mlebabeclap_flux_z_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                ((Box *)local_3a0,ncomp,(anon_class_280_8_76d672fa *)local_1d0);
      return;
    }
  }
  local_1d0._0_8_ = pFVar19;
  local_1d0._8_8_ = pFVar20;
  local_1c0 = pFVar21;
  MLABecLaplacian::FFlux
            (&local_3fc,(Real *)(lVar36 + 0x38),this->m_b_scalar,
             (Array<const_FArrayBox_*,_3> *)local_1d0,flux,sol,face_only,ncomp);
  return;
}

Assistant:

void
MLEBABecLap::FFlux (int amrlev, const MFIter& mfi, const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                    const FArrayBox& sol, Location flux_loc, const int face_only) const
{
    BL_PROFILE("MLEBABecLap::FFlux()");
    const int compute_flux_at_centroid = (Location::FaceCentroid == flux_loc) ? 1 : 0;
    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const int ncomp = getNComp();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    AMREX_D_TERM(const auto& bx = m_b_coeffs[amrlev][mglev][0][mfi];,
                 const auto& by = m_b_coeffs[amrlev][mglev][1][mfi];,
                 const auto& bz = m_b_coeffs[amrlev][mglev][2][mfi];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(box,0);,
                 Box const& ybx = amrex::surroundingNodes(box,1);,
                 Box const& zbx = amrex::surroundingNodes(box,2););
    AMREX_D_TERM(Array4<Real> const& fx = flux[0]->array();,
                 Array4<Real> const& fy = flux[1]->array();,
                 Array4<Real> const& fz = flux[2]->array(););

    const auto fabtyp = (flags) ? (*flags)[mfi].getType(box) : FabType::regular;
    if (fabtyp == FabType::covered) {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(xbx, ncomp, i, j, k, n,
        {
            fx(i,j,k,n) = 0.0;
        });
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(ybx, ncomp, i, j, k, n,
        {
            fy(i,j,k,n) = 0.0;
        });
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(zbx, ncomp, i, j, k, n,
        {
            fz(i,j,k,n) = 0.0;
        });
#endif
    } else if (fabtyp == FabType::regular) {
        MLABecLaplacian::FFlux(box, dxinv, m_b_scalar,
                               Array<FArrayBox const*,AMREX_SPACEDIM>{AMREX_D_DECL(&bx,&by,&bz)},
                               flux, sol, face_only, ncomp);
    } else if (compute_flux_at_centroid) {
        const auto& area = factory->getAreaFrac();
        const auto& fcent = factory->getFaceCent();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                     Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                     Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        Array4<int const> const& msk = ccmask.const_array(mfi);
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
        bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

        if (phi_on_centroid) amrex::Abort("phi_on_centroid is still a WIP");

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x(txbx, fx, apx, fcx, phi, bxcoef, msk, dhx, face_only, ncomp, xbx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y(tybx, fy, apy, fcy, phi, bycoef, msk, dhy, face_only, ncomp, ybx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z(tzbx, fz, apz, fcz, phi, bzcoef, msk, dhz, face_only, ncomp, zbx,
                                   beta_on_centroid, phi_on_centroid);
            }
        );
    } else {
        const auto& area = factory->getAreaFrac();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x_0(txbx, fx, apx, phi, bxcoef, dhx, face_only, ncomp, xbx);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y_0(tybx, fy, apy, phi, bycoef, dhy, face_only, ncomp, ybx);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z_0(tzbx, fz, apz, phi, bzcoef, dhz, face_only, ncomp, zbx);
            }
        );
    }
}